

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::BasicUsageCS::Run(BasicUsageCS *this)

{
  CallLogWrapper *this_00;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  GLuint program;
  undefined8 *puVar5;
  ulong uVar6;
  uint uVar7;
  char *format;
  GLuint data [512];
  string local_838;
  string local_818 [64];
  
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_ARB_compute_shader");
  if ((!bVar4) ||
     (bVar4 = glu::ContextInfo::isExtensionSupported
                        (((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)
                         ->m_contextInfo,"GL_ARB_shader_storage_buffer_object"), !bVar4)) {
    local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_838,
               "GL_ARB_shader_storage_buffer_object or GL_ARB_compute_shader not supported","");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_838);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  local_818[0]._M_dataplus._M_p = (pointer)&local_818[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_818,
             "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  uint data_inc[256];\n  uint data_dec[256];\n} g_out;\nvoid main() {\n  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
             ,"");
  program = CreateComputeProgram(this,local_818);
  this->prog_ = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818[0]._M_dataplus._M_p != &local_818[0].field_2) {
    operator_delete(local_818[0]._M_dataplus._M_p,local_818[0].field_2._M_allocated_capacity + 1);
    program = this->prog_;
  }
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar4 = CheckProgram(this,this->prog_,(bool *)0x0);
  if (!bVar4) {
    return -1;
  }
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->counter_buffer_);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->counter_buffer_);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,8,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
  puVar5 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,10);
  *puVar5 = 0x10000000000;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,1,1);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x800,local_818);
  std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
            (local_818,&stack0xffffffffffffffe8,0x12);
  std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
            (local_818,&stack0xffffffffffffffe8);
  uVar6 = 0;
  do {
    uVar3 = *(uint *)((long)&local_818[0]._M_dataplus._M_p + uVar6 * 4);
    uVar7 = *(uint *)((long)&local_818[0]._M_dataplus._M_p + uVar6 * 4 + 4);
    if (uVar3 != uVar7) {
      format = "Pair of values should be equal, got: %d, %d\n";
      goto LAB_008da981;
    }
    if (0x1fd < uVar6) {
      return 0;
    }
    uVar1 = uVar6 + 2;
    lVar2 = uVar6 * 4;
    uVar6 = uVar1;
  } while (uVar3 != *(uint *)((long)&local_818[0]._M_string_length + lVar2));
  uVar7 = (int)uVar1 - 2;
  format = "Too many same values found: %d, index: %d\n";
LAB_008da981:
  gl4cts::anon_unknown_0::Output(format,(ulong)uVar3,(ulong)uVar7);
  return -1;
}

Assistant:

virtual long Run()
	{

		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader") ||
			!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_storage_buffer_object"))
		{
			OutputNotSupported("GL_ARB_shader_storage_buffer_object or GL_ARB_compute_shader not supported");
			return NO_ERROR;
		}

		// create program
		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL
			   "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;" NL
			   "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;" NL
			   "layout(std430) buffer Output {" NL "  uint data_inc[256];" NL "  uint data_dec[256];" NL "} g_out;" NL
			   "void main() {" NL "  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);" NL
			   "  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);" NL "}";
		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 512 * sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(prog_);
		glDispatchCompute(4, 1, 1);

		GLuint data[512];
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, 512 * sizeof(GLuint), &data[0]);

		std::sort(data, data + 512);
		for (int i = 0; i < 512; i += 2)
		{
			if (data[i] != data[i + 1])
			{
				Output("Pair of values should be equal, got: %d, %d\n", data[i], data[i + 1]);
				return ERROR;
			}
			if (i < 510 && data[i] == data[i + 2])
			{
				Output("Too many same values found: %d, index: %d\n", data[i], i);
				return ERROR;
			}
		}

		return NO_ERROR;
	}